

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_IncrementalSolverInterface_T.h
# Opt level: O1

shared_ptr<JointPolicyDiscretePure> __thiscall
BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>::GetNewJpol
          (BGIP_IncrementalSolverInterface_T<JointPolicyPureVector> *this)

{
  int *piVar1;
  shared_count sVar2;
  JointPolicyPureVector *this_00;
  shared_count extraout_RDX;
  long in_RSI;
  shared_ptr<const_JointPolicyPureVectorForClusteredBG> *this_01;
  shared_ptr<JointPolicyDiscretePure> sVar3;
  shared_ptr<JointPolicyPureVectorForClusteredBG> JPPVfCBG;
  shared_ptr<JointPolicyPureVector> jpol;
  undefined1 local_88 [16];
  long local_78;
  shared_count sStack_70;
  shared_ptr<JointPolicyPureVector> local_68;
  shared_ptr<const_JointPolicyDiscretePure> local_58;
  I_PtPDpure_constPtr local_48;
  shared_ptr<const_JointPolicyPureVectorForClusteredBG> local_38;
  
  this_00 = (JointPolicyPureVector *)operator_new(0x98);
  local_48.px = *(element_type **)(in_RSI + 8);
  local_48.pn.pi_ = *(sp_counted_base **)(in_RSI + 0x10);
  if (*(long *)(in_RSI + 0x10) != 0) {
    LOCK();
    piVar1 = (int *)(*(long *)(in_RSI + 0x10) + 8);
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  local_88 = ZEXT816(0) << 0x20;
  JointPolicyPureVector::JointPolicyPureVector(this_00,&local_48);
  boost::shared_ptr<JointPolicyPureVector>::shared_ptr<JointPolicyPureVector>(&local_68,this_00);
  boost::detail::shared_count::~shared_count(&local_48.pn);
  boost::detail::shared_count::~shared_count((shared_count *)(local_88 + 8));
  boost::dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG,JointPolicyPureVector>
            ((boost *)local_88,&local_68);
  if (local_88._0_8_ != 0) {
    local_78 = *(long *)(local_88._0_8_ + 0x88);
    sStack_70.pi_ = *(sp_counted_base **)(local_88._0_8_ + 0x90);
    if (*(long *)(local_88._0_8_ + 0x90) != 0) {
      LOCK();
      piVar1 = (int *)(*(long *)(local_88._0_8_ + 0x90) + 8);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    local_58.px = *(element_type **)(local_78 + 0x170);
    local_58.pn.pi_ = *(sp_counted_base **)(local_78 + 0x178);
    if (*(long *)(local_78 + 0x178) != 0) {
      LOCK();
      piVar1 = (int *)(*(long *)(local_78 + 0x178) + 8);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    boost::detail::shared_count::~shared_count(&sStack_70);
    this_01 = (shared_ptr<const_JointPolicyPureVectorForClusteredBG> *)(local_88._0_8_ + 0x98);
    boost::
    dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG_const,JointPolicyDiscretePure_const>
              ((boost *)&local_38,&local_58);
    boost::shared_ptr<const_JointPolicyPureVectorForClusteredBG>::operator=(this_01,&local_38);
    boost::detail::shared_count::~shared_count(&local_38.pn);
    local_78 = *(long *)(local_88._0_8_ + 0x88);
    sStack_70.pi_ = *(sp_counted_base **)(local_88._0_8_ + 0x90);
    if (*(long *)(local_88._0_8_ + 0x90) != 0) {
      LOCK();
      piVar1 = (int *)(*(long *)(local_88._0_8_ + 0x90) + 8);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    (**(code **)(*(long *)local_88._0_8_ + 0x10))(local_88._0_8_,*(undefined4 *)(local_78 + 8));
    boost::detail::shared_count::~shared_count(&sStack_70);
    boost::detail::shared_count::~shared_count(&local_58.pn);
  }
  sVar2.pi_ = local_68.pn.pi_;
  *(undefined8 *)&(this->super_BGIP_IncrementalSolverInterface).field_0x8 = 0;
  local_68.pn.pi_ = (sp_counted_base *)0x0;
  *(element_type **)&this->super_BGIP_IncrementalSolverInterface = local_68.px;
  *(sp_counted_base **)&(this->super_BGIP_IncrementalSolverInterface).field_0x8 = sVar2.pi_;
  local_68.px = (element_type *)0x0;
  boost::detail::shared_count::~shared_count((shared_count *)(local_88 + 8));
  boost::detail::shared_count::~shared_count(&local_68.pn);
  sVar3.pn.pi_ = extraout_RDX.pi_;
  sVar3.px = (element_type *)this;
  return sVar3;
}

Assistant:

virtual boost::shared_ptr<JointPolicyDiscretePure> GetNewJpol() const
    //boost::shared_ptr<JP> GetNewJpol() const
    {
        boost::shared_ptr<JP> jpol = boost::shared_ptr<JP>(new JP(this->GetBGIPI()));
        // check whether it is a
        // JointPolicyPureVectorForClusteredBG, because then we
        // need to store more things
        boost::shared_ptr<JointPolicyPureVectorForClusteredBG> JPPVfCBG=
            boost::dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG>(jpol);
        if(JPPVfCBG)
        {
            boost::shared_ptr<const JointPolicyDiscretePure> pastJpol =
                JPPVfCBG->GetBG()->GetPastJointPolicyPVFCBG();
            JPPVfCBG->SetPrevJPPVfCBG(
                boost::dynamic_pointer_cast<const JointPolicyPureVectorForClusteredBG>(pastJpol));
            JPPVfCBG->SetDepth(JPPVfCBG->GetBG()->GetStage());
        }
        return(jpol);
    }